

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::safe> *timer)

{
  timer_status tVar1;
  timer_kind kind;
  timer_type *wheel_timer_00;
  timer_type *wheel_timer;
  timer_object_holder<timertt::thread_safety::safe> *timer_local;
  timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  wheel_timer_00 =
       timer_object_holder<timertt::thread_safety::safe>::
       cast_to<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                 (timer);
  tVar1 = std::atomic::operator_cast_to_timer_status
                    ((atomic *)
                     &(wheel_timer_00->super_timer_object<timertt::thread_safety::safe>).field_0xc);
  if (tVar1 == active) {
    remove_timer_from_wheel(this,wheel_timer_00);
    std::atomic<timertt::details::timer_status>::operator=
              ((atomic<timertt::details::timer_status> *)
               &(wheel_timer_00->super_timer_object<timertt::thread_safety::safe>).field_0xc,
               deactivated);
    kind = timer_type::kind(wheel_timer_00);
    engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
    ::dec_timer_count(&this->
                       super_engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                      ,kind);
    timer_object<timertt::thread_safety::safe>::decrement_references
              (&wheel_timer_00->super_timer_object<timertt::thread_safety::safe>);
  }
  else {
    tVar1 = std::atomic::operator_cast_to_timer_status
                      ((atomic *)
                       &(wheel_timer_00->super_timer_object<timertt::thread_safety::safe>).field_0xc
                      );
    if (tVar1 == wait_for_execution) {
      std::atomic<timertt::details::timer_status>::operator=
                ((atomic<timertt::details::timer_status> *)
                 &(wheel_timer_00->super_timer_object<timertt::thread_safety::safe>).field_0xc,
                 wait_for_deactivation);
    }
  }
  return;
}

Assistant:

void
	deactivate( timer_object_holder< THREAD_SAFETY > timer )
	{
		auto wheel_timer = timer.template cast_to< timer_type >();
		if( timer_status::active == wheel_timer->m_status )
		{
			// This is normal active timer. It can be safely
			// deactivated and destroyed.
			remove_timer_from_wheel( wheel_timer );

			wheel_timer->m_status = timer_status::deactivated;

			// Release timer object.
			this->dec_timer_count( wheel_timer->kind() );
			timer_object< THREAD_SAFETY >::decrement_references( wheel_timer );
		}
		else if( timer_status::wait_for_execution == wheel_timer->m_status )
		{
			// This timer is in execution list right now.
			// We can only changed its status.
			// Final deactivation will be done after execution of
			// timers actions.
			wheel_timer->m_status = timer_status::wait_for_deactivation;
		}
	}